

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O2

int dumbfile_igetw(DUMBFILE *f)

{
  uint uVar1;
  uint uVar2;
  
  if (f->pos < 0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = (*f->dfs->getc)(f->file);
    if ((int)uVar1 < 0) {
      f->pos = -1;
    }
    else {
      uVar2 = (*f->dfs->getc)(f->file);
      if ((int)uVar2 < 0) {
        f->pos = -1;
        uVar1 = uVar2;
      }
      else {
        f->pos = f->pos + 2;
        uVar1 = uVar1 | uVar2 << 8;
      }
    }
  }
  return uVar1;
}

Assistant:

int DUMBEXPORT dumbfile_igetw(DUMBFILE *f)
{
	int l, h;

	ASSERT(f);

	if (f->pos < 0)
		return -1;

	l = (*f->dfs->getc)(f->file);
	if (l < 0) {
		f->pos = -1;
		return l;
	}

	h = (*f->dfs->getc)(f->file);
	if (h < 0) {
		f->pos = -1;
		return h;
	}

	f->pos += 2;

	return l | (h << 8);
}